

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_printer.c
# Opt level: O1

void flatcc_json_printer_string_vector_field
               (flatcc_json_printer_t *ctx,flatcc_json_printer_table_descriptor_t *td,int id,
               char *name,size_t len)

{
  uint uVar1;
  ulong uVar2;
  uint *puVar3;
  long lVar4;
  int iVar5;
  char *pcVar6;
  uint *puVar7;
  size_t sVar8;
  size_t sVar9;
  
  uVar1 = id * 2 + 4;
  if ((uVar1 < (uint)td->vsize) &&
     (uVar2 = (ulong)*(ushort *)((long)td->vtable + (ulong)uVar1), uVar2 != 0)) {
    puVar3 = (uint *)(uVar2 + (long)td->table);
  }
  else {
    puVar3 = (uint *)0x0;
  }
  if (puVar3 != (uint *)0x0) {
    iVar5 = td->count;
    td->count = iVar5 + 1;
    if (iVar5 != 0) {
      pcVar6 = ctx->p;
      ctx->p = pcVar6 + 1;
      *pcVar6 = ',';
    }
    puVar7 = (uint *)((int *)((long)puVar3 + (ulong)*puVar3) + 1);
    iVar5 = *(int *)((long)puVar3 + (ulong)*puVar3);
    print_name(ctx,name,len);
    ctx->level = ctx->level + 1;
    pcVar6 = ctx->p;
    ctx->p = pcVar6 + 1;
    *pcVar6 = '[';
    if (iVar5 == 0) {
      iVar5 = 0;
    }
    else {
      pcVar6 = ctx->p;
      if (ctx->indent == '\0') {
        if (ctx->pflush <= pcVar6) {
          (*ctx->flush)(ctx,0);
        }
      }
      else {
        ctx->p = pcVar6 + 1;
        *pcVar6 = '\n';
        sVar8 = (ulong)ctx->indent * (long)ctx->level;
        pcVar6 = ctx->p;
        if (ctx->pflush < pcVar6 + sVar8) {
          if (ctx->pflush <= pcVar6) {
            (*ctx->flush)(ctx,0);
          }
          sVar9 = (long)ctx->pflush - (long)ctx->p;
          if (sVar9 < sVar8) {
            do {
              memset(ctx->p,0x20,sVar9);
              ctx->p = ctx->p + sVar9;
              sVar8 = sVar8 - sVar9;
              (*ctx->flush)(ctx,0);
              sVar9 = (long)ctx->pflush - (long)ctx->p;
            } while (sVar9 < sVar8);
          }
          pcVar6 = ctx->p;
        }
        memset(pcVar6,0x20,sVar8);
        ctx->p = ctx->p + sVar8;
      }
      print_string(ctx,(char *)((uint *)((long)puVar7 + (ulong)*puVar7) + 1),
                   (ulong)*(uint *)((long)puVar7 + (ulong)*puVar7));
      iVar5 = iVar5 + -1;
    }
    for (; iVar5 != 0; iVar5 = iVar5 + -1) {
      pcVar6 = ctx->p;
      ctx->p = pcVar6 + 1;
      *pcVar6 = ',';
      pcVar6 = ctx->p;
      if (ctx->indent == '\0') {
        if (ctx->pflush <= pcVar6) {
          (*ctx->flush)(ctx,0);
        }
      }
      else {
        ctx->p = pcVar6 + 1;
        *pcVar6 = '\n';
        sVar8 = (ulong)ctx->indent * (long)ctx->level;
        pcVar6 = ctx->p;
        if (ctx->pflush < pcVar6 + sVar8) {
          if (ctx->pflush <= pcVar6) {
            (*ctx->flush)(ctx,0);
          }
          sVar9 = (long)ctx->pflush - (long)ctx->p;
          if (sVar9 < sVar8) {
            do {
              memset(ctx->p,0x20,sVar9);
              ctx->p = ctx->p + sVar9;
              sVar8 = sVar8 - sVar9;
              (*ctx->flush)(ctx,0);
              sVar9 = (long)ctx->pflush - (long)ctx->p;
            } while (sVar9 < sVar8);
          }
          pcVar6 = ctx->p;
        }
        memset(pcVar6,0x20,sVar8);
        ctx->p = ctx->p + sVar8;
      }
      puVar7 = puVar7 + 1;
      print_string(ctx,(char *)((uint *)((long)puVar7 + (ulong)*puVar7) + 1),
                   (ulong)*(uint *)((long)puVar7 + (ulong)*puVar7));
    }
    if (ctx->indent != '\0') {
      pcVar6 = ctx->p;
      ctx->p = pcVar6 + 1;
      *pcVar6 = '\n';
      lVar4 = (long)ctx->level + -1;
      ctx->level = (int)lVar4;
      sVar8 = (ulong)ctx->indent * lVar4;
      pcVar6 = ctx->p;
      if (ctx->pflush < pcVar6 + sVar8) {
        if (ctx->pflush <= pcVar6) {
          (*ctx->flush)(ctx,0);
        }
        sVar9 = (long)ctx->pflush - (long)ctx->p;
        if (sVar9 < sVar8) {
          do {
            memset(ctx->p,0x20,sVar9);
            ctx->p = ctx->p + sVar9;
            sVar8 = sVar8 - sVar9;
            (*ctx->flush)(ctx,0);
            sVar9 = (long)ctx->pflush - (long)ctx->p;
          } while (sVar9 < sVar8);
        }
        pcVar6 = ctx->p;
      }
      memset(pcVar6,0x20,sVar8);
      ctx->p = ctx->p + sVar8;
    }
    pcVar6 = ctx->p;
    ctx->p = pcVar6 + 1;
    *pcVar6 = ']';
  }
  return;
}

Assistant:

void flatcc_json_printer_string_vector_field(flatcc_json_printer_t *ctx,
        flatcc_json_printer_table_descriptor_t *td,
        int id, const char *name, size_t len)
{
    const uoffset_t *p = get_field_ptr(td, id);
    uoffset_t count;

    if (p) {
        if (td->count++) {
            print_char(',');
        }
        p = read_uoffset_ptr(p);
        count = __flatbuffers_uoffset_read_from_pe(p);
        ++p;
        print_name(ctx, name, len);
        print_start('[');
        if (count) {
            print_nl();
            print_string_object(ctx, read_uoffset_ptr(p));
            --count;
        }
        while (count--) {
            ++p;
            print_char(',');
            print_nl();
            print_string_object(ctx, read_uoffset_ptr(p));
        }
        print_end(']');
    }
}